

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
move<kj::HashMap<kj::String,int>::Entry,kj::String&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t oldPos,size_t newPos,
          String *params)

{
  uchar *puVar1;
  long lVar2;
  uint uVar3;
  uchar *puVar4;
  ulong uVar5;
  ulong uVar6;
  uchar *puVar7;
  int iVar8;
  int iVar9;
  ArrayPtr<const_unsigned_char> s;
  
  puVar1 = (uchar *)(params->content).size_;
  puVar7 = puVar1;
  if (puVar1 != (uchar *)0x0) {
    puVar7 = (uchar *)(params->content).ptr;
  }
  puVar4 = (uchar *)0x0;
  if (puVar1 != (uchar *)0x0) {
    puVar4 = puVar1 + -1;
  }
  s.size_ = (size_t)puVar4;
  s.ptr = puVar7;
  uVar3 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  lVar2 = *(long *)(this + 0x10);
  uVar5 = (ulong)((int)*(ulong *)(this + 0x18) - 1U & uVar3);
  iVar9 = (int)oldPos + 2;
  iVar8 = *(int *)(lVar2 + 4 + uVar5 * 8);
  if (iVar9 != iVar8) {
    do {
      if (iVar8 == 0) {
        _::logHashTableInconsistency();
        return;
      }
      uVar6 = uVar5 + 1;
      uVar5 = uVar6 & 0xffffffff;
      if (uVar6 == *(ulong *)(this + 0x18)) {
        uVar5 = 0;
      }
      iVar8 = *(int *)(lVar2 + 4 + uVar5 * 8);
    } while (iVar9 != iVar8);
  }
  *(int *)(lVar2 + 4 + uVar5 * 8) = (int)newPos + 2;
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }